

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O3

void test_convert<int,double>(uint length,int value)

{
  bool bVar1;
  int *piVar2;
  undefined8 *puVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  shared_ptr<int> pt;
  shared_ptr<double> pu;
  
  uVar9 = (ulong)length;
  uVar8 = uVar9 * 4;
  if ((int)length < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  uVar10 = uVar9 * 8;
  if ((int)length < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar2 = (int *)operator_new__(uVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,piVar2,nosimd::common::free<int>);
  pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<double>);
  uVar6 = (int)length >> 2;
  piVar4 = piVar2;
  uVar7 = uVar6;
  if (3 < (int)uVar6) {
    do {
      *piVar4 = value;
      piVar4[1] = value;
      piVar4[2] = value;
      piVar4[3] = value;
      piVar4[4] = value;
      piVar4[5] = value;
      piVar4[6] = value;
      piVar4[7] = value;
      piVar4[8] = value;
      piVar4[9] = value;
      piVar4[10] = value;
      piVar4[0xb] = value;
      piVar4[0xc] = value;
      piVar4[0xd] = value;
      piVar4[0xe] = value;
      piVar4[0xf] = value;
      uVar6 = uVar7 - 4;
      piVar4 = piVar4 + 0x10;
      bVar1 = 7 < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  if (1 < (int)uVar6) {
    *piVar4 = value;
    piVar4[1] = value;
    piVar4[2] = value;
    piVar4[3] = value;
    piVar4[4] = value;
    piVar4[5] = value;
    piVar4[6] = value;
    piVar4[7] = value;
    uVar6 = uVar6 - 2;
    piVar4 = piVar4 + 8;
  }
  if (uVar6 != 0) {
    *piVar4 = value;
    piVar4[1] = value;
    piVar4[2] = value;
    piVar4[3] = value;
  }
  if ((length & 0xfffffffc) != length) {
    lVar5 = (long)(int)(length & 0xfffffffc);
    do {
      piVar2[lVar5] = value;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)length);
  }
  if (0 < (int)length) {
    uVar8 = 0;
    do {
      (&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar8] = (_func_int **)(double)piVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  if (length != 0) {
    uVar8 = 0;
    do {
      dVar11 = (double)(&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base)[uVar8] - (double)value;
      uVar10 = -(ulong)(dVar11 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar10 & (ulong)dVar11 |
                  (ulong)((double)value -
                         (double)(&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar8]) & uVar10)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = int, _U = double]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  if (pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}